

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
emplace<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>
          (QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,qsizetype i,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RSI;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> tmp;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff74;
  byte bVar6;
  GrowthPosition where;
  Inserter local_70;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                   in_RDI->size) &&
       (qVar3 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::
                freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_002f4368;
    }
    if ((in_RSI == (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x0)
       && (qVar3 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::
                   freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2f421a
                );
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_002f4368;
    }
  }
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
            ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                              *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                                     *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff74,uVar2))),
             (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> **)in_RDI,
             (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             CONCAT17(uVar5,in_stack_ffffffffffffff60));
  if ((bVar6 & 1) == 0) {
    QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::Inserter::Inserter
              (&local_70,in_RDI);
    QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::Inserter::insertOne
              ((Inserter *)CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff74,uVar2)))
               ,(qsizetype)in_RDI,
               (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
               CONCAT17(uVar5,in_stack_ffffffffffffff60));
    QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::Inserter::~Inserter
              (&local_70);
  }
  else {
    QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
              ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2f42f8);
    std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
              ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
               CONCAT17(uVar5,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::~pair
            ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2f4368);
LAB_002f4368:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }